

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O3

void __thiscall Epoll::epoll_del(Epoll *this,int fd,int event)

{
  int iVar1;
  iterator iVar2;
  epoll_event ev;
  uint local_20;
  uint local_1c;
  uint local_18;
  
  local_20 = fd;
  iVar2 = std::
          _Hashtable<int,_std::pair<const_int,_Epoll::io_event>,_std::allocator<std::pair<const_int,_Epoll::io_event>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->ep_event_map)._M_h,(key_type *)&local_20);
  if (iVar2.super__Node_iterator_base<std::pair<const_int,_Epoll::io_event>,_false>._M_cur !=
      (__node_type *)0x0) {
    local_1c = ~event & *(uint *)((long)iVar2.
                                        super__Node_iterator_base<std::pair<const_int,_Epoll::io_event>,_false>
                                        ._M_cur + 0x10);
    *(uint *)((long)iVar2.super__Node_iterator_base<std::pair<const_int,_Epoll::io_event>,_false>.
                    _M_cur + 0x10) = local_1c;
    if (local_1c == 0) {
      epoll_del(this,local_20);
    }
    else {
      local_18 = local_20;
      iVar1 = epoll_ctl(this->ep_epoll_fd,3,local_20,(epoll_event *)&local_1c);
      if ((iVar1 == -1) && (-1 < pr_level)) {
        printf("[%-5s][%s:%d] epoll ctl error for fd %d\n","error","epoll_del",0x47,(ulong)local_20)
        ;
      }
    }
  }
  return;
}

Assistant:

void Epoll::epoll_del(int fd, int event) {

    ep_event_map_iter ret;
    if (ret = ep_event_map.find(fd); ret == ep_event_map.end()) {
        return ;
    }

    int &target_event = ret->second.event;

    if (target_event = target_event & (~event); target_event == 0) {
        this->epoll_del(fd);
    }
    else {
        struct epoll_event ev;
        ev.events = target_event;
        ev.data.fd = fd;
        if (epoll_ctl(ep_epoll_fd, EPOLL_CTL_MOD, fd, &ev) == -1) {
            PR_ERROR("epoll ctl error for fd %d\n", fd);
            return;
        }
    }
}